

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerMSL::type_is_pointer(CompilerMSL *this,SPIRType *type)

{
  uint32_t id;
  SPIRType *pSVar1;
  byte local_31;
  SPIRType *parent_type;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  if ((type->pointer & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar1 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,id);
    local_31 = 1;
    if (type->pointer_depth <= pSVar1->pointer_depth) {
      local_31 = pSVar1->pointer ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_31 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool CompilerMSL::type_is_pointer(const SPIRType &type) const
{
	if (!type.pointer)
		return false;
	auto &parent_type = get<SPIRType>(type.parent_type);
	// Safeguards when we forget to set pointer_depth (there is an assert for it in type_to_glsl),
	// but the extra check shouldn't hurt.
	return (type.pointer_depth > parent_type.pointer_depth) || !parent_type.pointer;
}